

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_b_variance(double mu,double s,double b)

{
  double x;
  double dVar1;
  double dVar2;
  __type _Var3;
  double variance;
  double beta_pdf;
  double beta_cdf;
  double beta;
  double b_local;
  double s_local;
  double mu_local;
  
  x = (b - mu) / s;
  dVar1 = normal_01_pdf(x);
  dVar2 = normal_01_cdf(x);
  _Var3 = std::pow<double,int>(dVar1 / dVar2,2);
  return s * s * ((1.0 - (x * dVar1) / dVar2) - _Var3);
}

Assistant:

double normal_truncated_b_variance ( double mu, double s, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_B_VARIANCE: variance of the upper truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double B, the upper truncation limit.
//
//    Output, double NORMAL_TRUNCATED_B_VARIANCE, the variance of the PDF.
//
{
  double beta;
  double beta_cdf;
  double beta_pdf;
  double variance;

  beta = ( b - mu ) / s;

  beta_pdf = normal_01_pdf ( beta );

  beta_cdf = normal_01_cdf ( beta );

  variance = s * s * ( 1.0 
    - beta * beta_pdf / beta_cdf 
    - pow ( beta_pdf / beta_cdf, 2 ) );

  return variance;
}